

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O0

void __thiscall OpenMD::StatWriter::writePotVec(StatWriter *this,int i)

{
  bool bVar1;
  uint uVar2;
  double *pdVar3;
  undefined8 uVar4;
  ostream *this_00;
  ostream *in_RDI;
  uint j_1;
  uint j;
  bool foundError;
  potVec s;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  string local_70 [20];
  int in_stack_ffffffffffffffa4;
  Stats *in_stack_ffffffffffffffa8;
  uint local_50;
  Vector<double,_7U> local_48;
  
  Stats::getPotVecData(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  bVar1 = false;
  local_50 = 0;
  do {
    if (6 < local_50) {
      if (bVar1) {
        Stats::getTitle_abi_cxx11_
                  ((Stats *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (int)((ulong)in_RDI >> 0x20));
        uVar4 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s",uVar4);
        std::__cxx11::string::~string(local_70);
        painCave.isFatal = 1;
        simError();
      }
      else {
        for (uVar2 = 0; uVar2 < 7; uVar2 = uVar2 + 1) {
          this_00 = std::operator<<(in_RDI,"\t");
          pdVar3 = Vector<double,_7U>::operator[](&local_48,uVar2);
          std::ostream::operator<<(this_00,*pdVar3);
        }
      }
      return;
    }
    pdVar3 = Vector<double,_7U>::operator[](&local_48,local_50);
    uVar2 = std::isinf(*pdVar3);
    if ((uVar2 & 1) == 0) {
      pdVar3 = Vector<double,_7U>::operator[](&local_48,local_50);
      uVar2 = std::isnan(*pdVar3);
      if ((uVar2 & 1) != 0) goto LAB_001980d1;
    }
    else {
LAB_001980d1:
      bVar1 = true;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

void StatWriter::writePotVec(int i) {
    potVec s = stats_->getPotVecData(i);

    bool foundError = false;

    for (unsigned int j = 0; j < N_INTERACTION_FAMILIES; j++) {
      if (std::isinf(s[j]) || std::isnan(s[j])) foundError = true;
    }
    if (foundError) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StatWriter detected a numerical error writing: %s",
               stats_->getTitle(i).c_str());
      painCave.isFatal = 1;
      simError();
    } else {
      for (unsigned int j = 0; j < N_INTERACTION_FAMILIES; j++) {
        statfile_ << "\t" << s[j];
      }
    }
  }